

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::value::texcoord2d> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::texcoord2d>
          (optional<tinyusdz::value::texcoord2d> *__return_storage_ptr__,PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  bool bVar3;
  optional<tinyusdz::value::texcoord2d> local_30;
  
  pvVar1 = (this->_value).v_.vtable;
  if (pvVar1 == (vtable_type *)0x0) {
    bVar3 = false;
  }
  else {
    uVar2 = (*pvVar1->type_id)();
    bVar3 = uVar2 == 4;
  }
  if (((bVar3) || ((this->_blocked & 1U) != 0)) ||
     ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
      ((uVar2 = (*pvVar1->type_id)(), uVar2 == 0 ||
       ((pvVar1 = (this->_value).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar2 = (*pvVar1->type_id)(), uVar2 == 1)))))))) {
    __return_storage_ptr__->has_value_ = false;
    local_30.contained._0_4_ = 0;
    local_30.contained._4_4_ = 0;
    local_30.contained._8_4_ = 0;
    local_30.contained._12_4_ = 0;
  }
  else {
    tinyusdz::value::Value::get_value<tinyusdz::value::texcoord2d>(&local_30,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_30.has_value_;
    if (local_30.has_value_ != true) {
      return __return_storage_ptr__;
    }
  }
  *(undefined4 *)&__return_storage_ptr__->contained = local_30.contained._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_30.contained._4_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_30.contained._8_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_30.contained._12_4_;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }